

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O0

bool __thiscall
pstore::command_line::
list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
::simple_value(list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
               *this,string *v)

{
  bool bVar1;
  enumeration *__x;
  maybe<(anonymous_namespace)::enumeration,_void> local_28;
  maybe<(anonymous_namespace)::enumeration,_void> m;
  string *v_local;
  list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
  *this_local;
  
  m = (maybe<(anonymous_namespace)::enumeration,_void>)v;
  parser<(anonymous_namespace)::enumeration,_void>::operator()(&local_28,&this->parser_,v);
  bVar1 = maybe::operator_cast_to_bool((maybe *)&local_28);
  if (bVar1) {
    __x = maybe<(anonymous_namespace)::enumeration,_void>::value(&local_28);
    std::__cxx11::
    list<(anonymous_namespace)::enumeration,_std::allocator<(anonymous_namespace)::enumeration>_>::
    push_back(&this->values_,__x);
    this_local._7_1_ = 1;
  }
  maybe<(anonymous_namespace)::enumeration,_void>::~maybe(&local_28);
  if (!bVar1) {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool list<T, Parser>::simple_value (std::string const & v) {
            if (maybe<T> m = parser_ (v)) {
                values_.push_back (m.value ());
                return true;
            }
            return false;
        }